

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O3

void ATy(CUPDLPwork *w,CUPDLPvec *aty,CUPDLPvec *y)

{
  CUPDLP_DEVICE CVar1;
  CUPDLPtimers *pCVar2;
  char *__s;
  double dVar3;
  double dVar4;
  
  dVar3 = getTimeStamp();
  CVar1 = w->problem->data->device;
  if (CVar1 == CPU) {
    ATyCPU(w,aty->data,y->data);
    dVar4 = getTimeStamp();
    pCVar2 = w->timers;
    pCVar2->dAtyTime = (dVar4 - dVar3) + pCVar2->dAtyTime;
    pCVar2->nAtyCalls = pCVar2->nAtyCalls + 1;
    return;
  }
  if ((CVar1 == SINGLE_GPU) || (CVar1 == MULTI_GPU)) {
    __s = "GPU not supported in CPU build";
  }
  else {
    __s = "Error: Unknown device type in ATy";
  }
  puts(__s);
  exit(1);
}

Assistant:

void ATy(CUPDLPwork *w, CUPDLPvec *aty, const CUPDLPvec *y)

{
  cupdlp_float begin = getTimeStamp();

  CUPDLPdata *d = w->problem->data;
  switch (d->device) {
    case CPU:
      ATyCPU(w, aty->data, y->data);
      break;
    case SINGLE_GPU:
#ifndef CUPDLP_CPU
      ATy_single_gpu(w, y->cuda_vec, aty->cuda_vec);
#else
      printf("GPU not supported in CPU build\n");
      exit(1);
#endif
      break;
    case MULTI_GPU:
#ifndef CUPDLP_CPU
      ATy_multi_gpu(d, aty->data, y->data);
#else
      printf("GPU not supported in CPU build\n");
      exit(1);
#endif
      break;
    default:
      printf("Error: Unknown device type in ATy\n");
      exit(1);
  }
#if PDHG_USE_TIMERS
  w->timers->dAtyTime += getTimeStamp() - begin;
  w->timers->nAtyCalls++;
#endif
}